

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

void draw_item_focus(Fl_Boxtype B,Fl_Color fg,Fl_Color bg,int X,int Y,int W,int H)

{
  bool bVar1;
  Fl_Color FVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar8;
  
  uVar11 = 1;
  bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
  if (bVar1) {
    FVar2 = fl_contrast(B,fg);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    iVar3 = Fl::box_dx(FL_NO_BOX);
    uVar4 = iVar3 + bg;
    iVar3 = Fl::box_dy(FL_NO_BOX);
    uVar5 = iVar3 + X;
    uVar8 = (ulong)uVar5;
    uVar6 = Fl::box_dw(FL_NO_BOX);
    uVar12 = (Y - uVar6) - 2;
    uVar7 = Fl::box_dh(FL_NO_BOX);
    iVar3 = (W - uVar7) + -2;
    uVar9 = 0;
    if (0 < (int)uVar12) {
      do {
        uVar11 = uVar9 + 1;
        if ((uVar11 & 1) != 0) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                    (fl_graphics_driver,(ulong)(uVar9 + uVar4),uVar8);
        }
        uVar9 = uVar11;
      } while (uVar12 != uVar11);
      uVar11 = ~uVar6 + Y;
    }
    if (0 < iVar3) {
      iVar10 = iVar3;
      do {
        if ((uVar11 & 1) != 0) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                    (fl_graphics_driver,(ulong)(uVar4 + uVar12),uVar8);
        }
        uVar11 = uVar11 + 1;
        uVar8 = (ulong)((int)uVar8 + 1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    if (0 < (int)uVar12) {
      iVar10 = Y + uVar11;
      iVar13 = ~uVar6 + Y;
      do {
        if ((uVar11 & 1) != 0) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                    (fl_graphics_driver,(ulong)((uVar4 + iVar13) - 1),(ulong)(iVar3 + uVar5));
        }
        uVar11 = uVar11 + 1;
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
      uVar11 = (iVar10 + -2) - uVar6;
    }
    if (0 < iVar3) {
      iVar3 = ~uVar7 + W;
      do {
        if ((uVar11 & 1) != 0) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                    (fl_graphics_driver,(ulong)uVar4,(ulong)((uVar5 + iVar3) - 1));
        }
        uVar11 = uVar11 + 1;
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
    }
  }
  return;
}

Assistant:

static void draw_item_focus(Fl_Boxtype B, Fl_Color fg, Fl_Color bg, int X, int Y, int W, int H) {
  if (!Fl::visible_focus()) return;
  switch (B) {
    case FL_DOWN_BOX:
    case FL_DOWN_FRAME:
    case FL_THIN_DOWN_BOX:
    case FL_THIN_DOWN_FRAME:
      X ++;
      Y ++;
    default:
      break;
  }
  fl_color(fl_contrast(fg, bg));

#if defined(USE_X11) || defined(__APPLE_QUARTZ__)
  fl_line_style(FL_DOT);
  fl_rect(X + Fl::box_dx(B), Y + Fl::box_dy(B),
          W - Fl::box_dw(B) - 1, H - Fl::box_dh(B) - 1);
  fl_line_style(FL_SOLID);
#else
  // Some platforms don't implement dotted line style, so draw
  // every other pixel around the focus area...
  //
  // Also, QuickDraw (MacOS) does not support line styles specifically,
  // and the hack we use in fl_line_style() will not draw horizontal lines
  // on odd-numbered rows...
  int i, xx, yy;

  X += Fl::box_dx(B);
  Y += Fl::box_dy(B);
  W -= Fl::box_dw(B) + 2;
  H -= Fl::box_dh(B) + 2;

  for (xx = 0, i = 1; xx < W; xx ++, i ++) if (i & 1) fl_point(X + xx, Y);
  for (yy = 0; yy < H; yy ++, i ++) if (i & 1) fl_point(X + W, Y + yy);
  for (xx = W; xx > 0; xx --, i ++) if (i & 1) fl_point(X + xx, Y + H);
  for (yy = H; yy > 0; yy --, i ++) if (i & 1) fl_point(X, Y + yy);
#endif
}